

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hybrid2d_refinement_pattern_tests.cc
# Opt level: O0

void __thiscall
lf::refinement::test::TopRefTest_TopTriaRef_Test::~TopRefTest_TopTriaRef_Test
          (TopRefTest_TopTriaRef_Test *this)

{
  TopRefTest_TopTriaRef_Test *this_local;
  
  testing::Test::~Test(&this->super_Test);
  return;
}

Assistant:

TEST(TopRefTest, TopTriaRef) {
  // Copy "refinement"
  {
    Hybrid2DRefinementPattern rp(lf::base::RefEl::kTria(), RefPat::rp_copy);
    lt_polys_t child_polygons(rp.ChildPolygons(0));
    std::cout << "COPY: " << child_polygons << std::endl;
    std::cout << "Area = " << SumTwiceAreaPolygons(child_polygons) << std::endl;
    EXPECT_EQ(SumTwiceAreaPolygons(child_polygons),
              std::pow(rp.LatticeConst(), 2));
  }
  // Bisection refinement
  for (int anchor = 0; anchor < 3; anchor++) {
    Hybrid2DRefinementPattern rp(lf::base::RefEl::kTria(), RefPat::rp_bisect,
                                 anchor);
    lt_polys_t child_polygons(rp.ChildPolygons(0));
    std::cout << "BISECT(anchor = " << anchor << ") : " << child_polygons
              << std::endl;
    std::cout << "Area = " << SumTwiceAreaPolygons(child_polygons) << std::endl;

    EXPECT_EQ(SumTwiceAreaPolygons(child_polygons),
              std::pow(rp.LatticeConst(), 2));
  }
  // Trisection refinement
  for (int anchor = 0; anchor < 3; anchor++) {
    Hybrid2DRefinementPattern rp1(lf::base::RefEl::kTria(), RefPat::rp_trisect,
                                  anchor);
    Hybrid2DRefinementPattern rp2(lf::base::RefEl::kTria(),
                                  RefPat::rp_trisect_left, anchor);
    lt_polys_t child_polygons1(rp1.ChildPolygons(0));
    lt_polys_t child_polygons2(rp2.ChildPolygons(0));
    std::cout << "TRISECT(anchor=" << anchor << ") : " << child_polygons1
              << std::endl;
    std::cout << "Area = " << SumTwiceAreaPolygons(child_polygons1)
              << std::endl;

    std::cout << "TRISECT_LEFT(anchor=" << anchor << ") : " << child_polygons2
              << std::endl;
    std::cout << "Area = " << SumTwiceAreaPolygons(child_polygons2)
              << std::endl;

    EXPECT_EQ(SumTwiceAreaPolygons(child_polygons1),
              std::pow(rp1.LatticeConst(), 2));
    EXPECT_EQ(SumTwiceAreaPolygons(child_polygons2),
              std::pow(rp2.LatticeConst(), 2));
  }
  // Splitting into four triangles
  for (int anchor = 0; anchor < 3; anchor++) {
    Hybrid2DRefinementPattern rp(lf::base::RefEl::kTria(), RefPat::rp_quadsect,
                                 anchor);
    lt_polys_t child_polygons(rp.ChildPolygons(0));
    std::cout << "QUADSECT(anchor=" << anchor << ") : " << child_polygons
              << std::endl;
    std::cout << "Area = " << SumTwiceAreaPolygons(child_polygons) << std::endl;
    EXPECT_EQ(SumTwiceAreaPolygons(child_polygons),
              std::pow(rp.LatticeConst(), 2));
  }
  // Regular refinement
  {
    Hybrid2DRefinementPattern rp(lf::base::RefEl::kTria(), RefPat::rp_regular);
    lt_polys_t child_polygons(rp.ChildPolygons(0));
    std::cout << "REGULAR: " << child_polygons << std::endl;
    std::cout << "Area = " << SumTwiceAreaPolygons(child_polygons) << std::endl;

    EXPECT_EQ(SumTwiceAreaPolygons(child_polygons),
              std::pow(rp.LatticeConst(), 2));
  }
  // Bayrcentric refinement
  {
    Hybrid2DRefinementPattern rp(lf::base::RefEl::kTria(),
                                 RefPat::rp_barycentric);
    lt_polys_t child_polygons(rp.ChildPolygons(0));
    std::cout << "BARYCENTRIC: " << child_polygons << std::endl;
    std::cout << "Area = " << SumTwiceAreaPolygons(child_polygons) << std::endl;

    EXPECT_EQ(SumTwiceAreaPolygons(child_polygons),
              std::pow(rp.LatticeConst(), 2));
  }
}